

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_http.hpp
# Opt level: O1

void __thiscall
SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::stop
          (ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_> *this)

{
  basic_socket_acceptor<asio::ip::tcp> *pbVar1;
  pthread_mutex_t *__mutex;
  impl_type *piVar2;
  reactor *prVar3;
  int iVar4;
  undefined8 uVar5;
  implementation_type *piVar6;
  _Hash_node_base *p_Var7;
  bool bVar8;
  error_code ec;
  scoped_lock local_48;
  undefined1 local_38 [8];
  epoll_data_t local_30;
  undefined4 local_28;
  undefined8 local_20;
  
  pbVar1 = (this->acceptor)._M_t.
           super___uniq_ptr_impl<asio::basic_socket_acceptor<asio::ip::tcp>,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_asio::basic_socket_acceptor<asio::ip::tcp>_*,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
           .super__Head_base<0UL,_asio::basic_socket_acceptor<asio::ip::tcp>_*,_false>._M_head_impl;
  if (pbVar1 != (basic_socket_acceptor<asio::ip::tcp> *)0x0) {
    local_28 = 0;
    local_20 = std::_V2::system_category();
    piVar6 = &(pbVar1->
              super_basic_io_object<asio::detail::reactive_socket_service<asio::ip::tcp>,_true>).
              implementation_;
    asio::detail::reactive_socket_service_base::close
              ((reactive_socket_service_base *)
               ((long)(pbVar1->
                      super_basic_io_object<asio::detail::reactive_socket_service<asio::ip::tcp>,_true>
                      ).service_ + 0x28),(int)piVar6);
    __mutex = (pthread_mutex_t *)
              (this->connections_mutex).super___shared_ptr<std::mutex,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    iVar4 = pthread_mutex_lock(__mutex);
    if (iVar4 != 0) {
      uVar5 = std::__throw_system_error(iVar4);
      __clang_call_terminate(uVar5);
    }
    for (p_Var7 = (((this->connections).
                    super___shared_ptr<std::unordered_set<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*,_std::hash<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*>,_std::equal_to<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*>,_std::allocator<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->_M_h)._M_before_begin._M_nxt; p_Var7 != (_Hash_node_base *)0x0;
        p_Var7 = p_Var7->_M_nxt) {
      Connection::close((Connection *)p_Var7[1]._M_nxt,(int)piVar6);
    }
    std::
    _Hashtable<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*,_SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*,_std::allocator<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*>,_std::__detail::_Identity,_std::equal_to<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*>,_std::hash<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::clear(&((this->connections).
              super___shared_ptr<std::unordered_set<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*,_std::hash<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*>,_std::equal_to<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*>,_std::allocator<SimpleWeb::ServerBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Connection_*>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->_M_h);
    pthread_mutex_unlock(__mutex);
    if (this->internal_io_service != false) {
      piVar2 = ((this->io_service).super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->impl_;
      local_48.mutex_ = &piVar2->mutex_;
      bVar8 = (piVar2->mutex_).enabled_ == true;
      if (bVar8) {
        pthread_mutex_lock((pthread_mutex_t *)&(piVar2->mutex_).mutex_);
      }
      piVar2->stopped_ = true;
      local_48.locked_ = bVar8;
      if ((local_48.mutex_)->enabled_ == true) {
        asio::detail::posix_event::
        signal_all<asio::detail::conditionally_enabled_mutex::scoped_lock>
                  (&(piVar2->wakeup_event_).event_,&local_48);
      }
      unique0x100002fb = (select_interrupter *)CONCAT44(local_30.fd,local_38._4_4_);
      if ((piVar2->task_interrupted_ == false) &&
         (prVar3 = piVar2->task_,
         unique0x10000303 = (select_interrupter *)CONCAT44(local_30.fd,local_38._4_4_),
         prVar3 != (reactor *)0x0)) {
        piVar2->task_interrupted_ = true;
        local_38._0_4_ = 0x80000009;
        unique0x00004780 = &prVar3->interrupter_;
        epoll_ctl(prVar3->epoll_fd_,3,(prVar3->interrupter_).read_descriptor_,
                  (epoll_event *)local_38);
      }
      if (local_48.locked_ == true) {
        pthread_mutex_unlock((pthread_mutex_t *)&(local_48.mutex_)->mutex_);
      }
    }
  }
  return;
}

Assistant:

void write(StatusCode status_code, std::istream &content, const CaseInsensitiveMultimap &header = CaseInsensitiveMultimap()) {
        *this << "HTTP/1.1 " << SimpleWeb::status_code(status_code) << "\r\n";
        content.seekg(0, std::ios::end);
        auto size = content.tellg();
        content.seekg(0, std::ios::beg);
        write_header(header, size);
        if(size)
          *this << content.rdbuf();
      }